

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offset.cpp
# Opt level: O1

pair<double,_double> runBenchmark(void)

{
  long lVar1;
  long lVar2;
  long lVar3;
  pair<double,_double> pVar4;
  
  lVar1 = std::chrono::_V2::steady_clock::now();
  lVar2 = std::chrono::_V2::steady_clock::now();
  lVar3 = std::chrono::_V2::steady_clock::now();
  pVar4.first = (double)(lVar2 - lVar1) / 1000000000.0;
  lVar1 = std::chrono::_V2::steady_clock::now();
  pVar4.second = (double)(lVar1 - lVar3) / 1000000000.0;
  return pVar4;
}

Assistant:

std::pair<double, double> runBenchmark() {
  SmallOffset* soa = new SmallOffset[LENGTH];
  LargeOffset* loa = new LargeOffset[LENGTH];
  const double d1 = benchmark(benchmarkOffset<SmallOffset>, soa, LENGTH).count();
  const double d2 = benchmark(benchmarkOffset<LargeOffset>, loa, LENGTH).count();
  delete[] soa;
  delete[] loa;
  return {d1, d2};
}